

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

int32_t __thiscall
helics::FederateState::getHandleOption
          (FederateState *this,InterfaceHandle handle,char iType,int32_t option)

{
  int32_t iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = (int)CONCAT71(in_register_00000011,iType);
  if (iVar2 == 0x65) {
    iVar1 = InterfaceInfo::getEndpointProperty(&this->interfaceInformation,handle,option);
    return iVar1;
  }
  if (iVar2 != 0x70) {
    if (iVar2 == 0x69) {
      iVar1 = InterfaceInfo::getInputProperty(&this->interfaceInformation,handle,option);
      return iVar1;
    }
    return 0;
  }
  iVar1 = InterfaceInfo::getPublicationProperty(&this->interfaceInformation,handle,option);
  return iVar1;
}

Assistant:

int32_t FederateState::getHandleOption(InterfaceHandle handle, char iType, int32_t option) const
{
    switch (iType) {
        case 'i':
            return interfaceInformation.getInputProperty(handle, option);
        case 'p':
            return interfaceInformation.getPublicationProperty(handle, option);
        case 'e':
            return interfaceInformation.getEndpointProperty(handle, option);
        default:
            break;
    }
    return 0;
}